

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstracttextdocumentlayout.cpp
# Opt level: O1

void QAbstractTextDocumentLayout::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  offset_in_QAbstractTextDocumentLayout_to_subr *candidate;
  void **ppvVar5;
  void **ppvVar6;
  int iVar7;
  long in_FS_OFFSET;
  undefined8 in_XMM1_Qa;
  void *_a_1 [2];
  void *_a_2 [2];
  void *local_48;
  undefined4 *puStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  void *local_28 [2];
  long local_18;
  
  ppvVar5 = &local_48;
  ppvVar6 = &local_48;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == IndexOfMethod) {
    plVar1 = (long *)_a[1];
    if ((((((code *)*plVar1 == update) && (uVar4 = 0, plVar1[1] == 0)) ||
         (((code *)*plVar1 == updateBlock && (uVar4 = 2, plVar1[1] == 0)))) ||
        (((code *)*plVar1 == documentSizeChanged && (uVar4 = 3, plVar1[1] == 0)))) ||
       (((code *)*plVar1 == pageCountChanged && (uVar4 = 4, plVar1[1] == 0)))) {
      *(undefined4 *)*_a = uVar4;
    }
    goto LAB_0047ca50;
  }
  if (_c != InvokeMetaMethod) goto LAB_0047ca50;
  switch(_id) {
  case 0:
    ppvVar5 = (void **)_a[1];
    goto LAB_0047c9c9;
  case 1:
    local_48 = (void *)0x0;
    puStack_40 = (undefined4 *)0x0;
    local_38 = 0x41cdcd6500000000;
    uStack_30 = 0x41cdcd6500000000;
    ppvVar6 = local_28;
LAB_0047c9c9:
    *(undefined4 *)ppvVar6 = 0xaaaaaaaa;
    *(undefined4 *)((long)ppvVar6 + 4) = 0xaaaaaaaa;
    *(undefined4 *)(ppvVar6 + 1) = 0xaaaaaaaa;
    *(undefined4 *)((long)ppvVar6 + 0xc) = 0xaaaaaaaa;
    *ppvVar6 = (void *)0x0;
    ppvVar6[1] = ppvVar5;
    iVar7 = 0;
    break;
  case 2:
    puStack_40 = (undefined4 *)_a[1];
    local_48 = (void *)0x0;
    iVar7 = 2;
    ppvVar6 = &local_48;
    break;
  case 3:
    puStack_40 = (undefined4 *)_a[1];
    local_48 = (void *)0x0;
    iVar7 = 3;
    ppvVar6 = &local_48;
    break;
  case 4:
    local_28[0]._0_4_ = *_a[1];
    puStack_40 = (undefined4 *)local_28;
    local_48 = (void *)0x0;
    iVar7 = 4;
    ppvVar6 = &local_48;
    break;
  case 5:
    uVar4 = (**(code **)(**(long **)(*(long *)(_o + 8) + 8) + 0x70))();
    if ((undefined4 *)*_a != (undefined4 *)0x0) {
      *(undefined4 *)*_a = uVar4;
    }
    goto LAB_0047ca50;
  case 6:
    uVar3 = (**(code **)(**(long **)(*(long *)(_o + 8) + 8) + 0x78))();
    puVar2 = (undefined8 *)*_a;
    if (puVar2 != (undefined8 *)0x0) {
      *puVar2 = uVar3;
      puVar2[1] = in_XMM1_Qa;
    }
  default:
    goto LAB_0047ca50;
  }
  QMetaObject::activate(_o,&staticMetaObject,iVar7,ppvVar6);
LAB_0047ca50:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractTextDocumentLayout::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QAbstractTextDocumentLayout *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->update((*reinterpret_cast< std::add_pointer_t<QRectF>>(_a[1]))); break;
        case 1: _t->update(); break;
        case 2: _t->updateBlock((*reinterpret_cast< std::add_pointer_t<QTextBlock>>(_a[1]))); break;
        case 3: _t->documentSizeChanged((*reinterpret_cast< std::add_pointer_t<QSizeF>>(_a[1]))); break;
        case 4: _t->pageCountChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: { int _r = _t->d_func()->_q_dynamicPageCountSlot();
            if (_a[0]) *reinterpret_cast< int*>(_a[0]) = std::move(_r); }  break;
        case 6: { QSizeF _r = _t->d_func()->_q_dynamicDocumentSizeSlot();
            if (_a[0]) *reinterpret_cast< QSizeF*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QAbstractTextDocumentLayout::*)(const QRectF & )>(_a, &QAbstractTextDocumentLayout::update, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractTextDocumentLayout::*)(const QTextBlock & )>(_a, &QAbstractTextDocumentLayout::updateBlock, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractTextDocumentLayout::*)(const QSizeF & )>(_a, &QAbstractTextDocumentLayout::documentSizeChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractTextDocumentLayout::*)(int )>(_a, &QAbstractTextDocumentLayout::pageCountChanged, 4))
            return;
    }
}